

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_mallocLeakGivesAdditionalWarning_Test::testBody
          (TEST_MemoryLeakDetectorTest_mallocLeakGivesAdditionalWarning_Test *this)

{
  MemoryLeakDetector *this_00;
  TestMemoryAllocator *allocator;
  char *pcVar1;
  UtestShell *pUVar2;
  undefined1 local_28 [8];
  SimpleString output;
  char *mem;
  TEST_MemoryLeakDetectorTest_mallocLeakGivesAdditionalWarning_Test *this_local;
  
  this_00 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  allocator = defaultMallocAllocator();
  output.bufferSize_ =
       (size_t)MemoryLeakDetector::allocMemory(this_00,allocator,100,"ALLOC.c",10,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pcVar1 = MemoryLeakDetector::report
                     ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                      mem_leak_period_checking);
  SimpleString::SimpleString((SimpleString *)local_28,pcVar1);
  pUVar2 = UtestShell::getCurrent();
  pcVar1 = SimpleString::asCharString((SimpleString *)local_28);
  (*pUVar2->_vptr_UtestShell[0xc])
            (pUVar2,
             "Memory leak reports about malloc and free can be caused by allocating using the cpputest version of malloc"
             ,pcVar1,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x194);
  (*PlatformSpecificFree)((void *)output.bufferSize_);
  SimpleString::~SimpleString((SimpleString *)local_28);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, mallocLeakGivesAdditionalWarning)
{
    char* mem = detector->allocMemory(defaultMallocAllocator(), 100, "ALLOC.c", 10);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    STRCMP_CONTAINS("Memory leak reports about malloc and free can be caused by allocating using the cpputest version of malloc", output.asCharString());
    PlatformSpecificFree(mem);
}